

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

void hexFrom(char *dest,void *src,size_t count)

{
  long in_RDX;
  octet *in_RSI;
  char *in_RDI;
  long local_18;
  octet *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_18 != 0) {
    hexFromOUpper(local_8,*local_10);
    local_8 = local_8 + 2;
    local_10 = local_10 + 1;
    local_18 = local_18 + -1;
  }
  *local_8 = '\0';
  return;
}

Assistant:

void hexFrom(char* dest, const void* src, size_t count)
{
	ASSERT(memIsDisjoint2(src, count, dest, 2 * count + 1));
	for (; count--; dest += 2, src = (const octet*)src + 1)
		hexFromOUpper(dest, *(const octet*)src);
	*dest = '\0';
}